

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extr.c
# Opt level: O0

void extract(byte *ptr,int64_t len)

{
  long lVar1;
  int iVar2;
  uint32_t uVar3;
  uint *puVar4;
  uint32_t n_1;
  char *n;
  byte c;
  long lStack_38;
  int i;
  size_t sz;
  byte *bc;
  Elf64_Shdr *s;
  Elf64_Ehdr *h;
  int64_t len_local;
  byte *ptr_local;
  
  if (len < 0x40) {
    printf("file too small\n");
  }
  else if ((((*ptr == '\x7f') || (ptr[1] == 'E')) || (ptr[2] == 'L')) || (ptr[3] == 'F')) {
    if (ptr[4] == 2) {
      if (ptr[5] == '\x01') {
        if (ptr[6] == '\x01') {
          if ((*(short *)(ptr + 0x10) == 1) || (*(short *)(ptr + 0x10) == 2)) {
            if (*(short *)(ptr + 0x3e) == 0) {
              printf("ELF file without string table\n");
            }
            else {
              lVar1 = *(long *)(ptr + (long)(int)(uint)*(ushort *)(ptr + 0x3e) * 0x40 +
                                      *(long *)(ptr + 0x28) + 0x18);
              if (debug != 0) {
                printf("e_type= %d\n",(ulong)*(ushort *)(ptr + 0x10));
                printf("e_machine= %d\n",(ulong)*(ushort *)(ptr + 0x12));
                printf("e_version= %d\n",(ulong)*(uint *)(ptr + 0x14));
                printf("e_entry= %lu\n",*(undefined8 *)(ptr + 0x18));
                printf("e_phoff= %lu\n",*(undefined8 *)(ptr + 0x20));
                printf("e_shoff= %lu\n",*(undefined8 *)(ptr + 0x28));
                printf("e_flags= %d\n",(ulong)*(uint *)(ptr + 0x30));
                printf("e_ehsize= %d\n",(ulong)*(ushort *)(ptr + 0x34));
                printf("e_phentsize= %d\n",(ulong)*(ushort *)(ptr + 0x36));
                printf("e_phnum= %d\n",(ulong)*(ushort *)(ptr + 0x38));
                printf("e_shentsize= %d\n",(ulong)*(ushort *)(ptr + 0x3a));
                printf("e_shnum= %d\n",(ulong)*(ushort *)(ptr + 0x3c));
                printf("e_shstrndx= %d\n",(ulong)*(ushort *)(ptr + 0x3e));
              }
              for (n._4_4_ = 0; (int)n._4_4_ < (int)(uint)*(ushort *)(ptr + 0x3c);
                  n._4_4_ = n._4_4_ + 1) {
                puVar4 = (uint *)(ptr + (long)(int)n._4_4_ * 0x40 + *(long *)(ptr + 0x28));
                iVar2 = strcmp((char *)(ptr + (ulong)*puVar4 + lVar1),".llvmbc");
                if (iVar2 == 0) {
                  if (debug != 0) {
                    printf("%-3d %s\n",(ulong)n._4_4_,ptr + (ulong)*puVar4 + lVar1);
                    printf("   sh_name = %u\n",(ulong)*puVar4);
                    printf("   sh_type = %u\n",(ulong)puVar4[1]);
                    printf("   sh_flags = %lu\n",*(undefined8 *)(puVar4 + 2));
                    printf("   sh_addr = %lu\n",*(undefined8 *)(puVar4 + 4));
                    printf("   sh_offset = %lu\n",*(undefined8 *)(puVar4 + 6));
                    printf("   sh_size = %lu\n",*(undefined8 *)(puVar4 + 8));
                    printf("   sh_link = %u\n",(ulong)puVar4[10]);
                    printf("   sh_info = %u\n",(ulong)puVar4[0xb]);
                    printf("   sh_addralign = %lu\n",*(undefined8 *)(puVar4 + 0xc));
                    printf("   sh_entsize = %lu\n",*(undefined8 *)(puVar4 + 0xe));
                  }
                  sz = (size_t)(ptr + *(long *)(puVar4 + 6));
                  for (lStack_38 = *(long *)(puVar4 + 8); lStack_38 != 0;
                      lStack_38 = lStack_38 - (ulong)uVar3) {
                    for (; (lStack_38 != 0 && (*(char *)sz == '\0')); sz = sz + 1) {
                      lStack_38 = lStack_38 + -1;
                    }
                    uVar3 = dumpbits((byte *)sz,lStack_38);
                    if (uVar3 == 0) break;
                    readmod((byte *)sz,(ulong)uVar3);
                    sz = sz + uVar3;
                  }
                }
              }
            }
          }
          else {
            printf("unsupported ELF File type\n");
          }
        }
        else {
          printf("unsupported ELF File version\n");
        }
      }
      else {
        printf("unsupported ELF File byte order\n");
      }
    }
    else {
      printf("32 bits ELF not supported [%d]",(ulong)ptr[4]);
    }
  }
  else {
    printf("not ELF file\n");
  }
  return;
}

Assistant:

void extract(byte* ptr, int64_t len) {
    Elf64_Ehdr *h;
	Elf64_Shdr *s;
	byte *bc;
	size_t sz;
	int i;
	byte c;
	char *n;

    if (len < (int64_t) sizeof(Elf64_Ehdr)) {
        printf("file too small\n");
        return;
    }
    
    h = (Elf64_Ehdr *) ptr;
	if (h->e_ident[EI_MAG0] != 0x7f &&
		h->e_ident[EI_MAG1] != 'E' &&
		h->e_ident[EI_MAG2] != 'L' &&
		h->e_ident[EI_MAG3] != 'F') {
		printf("not ELF file\n");
		return;
	}

	c = h->e_ident[EI_CLASS];
	if (c != ELFCLASS64) {
		printf("32 bits ELF not supported [%d]", c);
		return;
	}

	if (h->e_ident[EI_DATA] != ELFDATA2LSB) {
		printf("unsupported ELF File byte order\n");
		return;
	}

	if (h->e_ident[EI_VERSION] != EV_CURRENT) {
		printf("unsupported ELF File version\n");
		return;
	}

	if (h->e_type != ET_REL && h->e_type != ET_EXEC) {
		printf("unsupported ELF File type\n");
		return;
	}

	if (h->e_shstrndx == SHN_UNDEF) {
		printf("ELF file without string table\n");
		return;
	}

	s = (Elf64_Shdr *) (ptr + h->e_shoff) + h->e_shstrndx;
	n = (char *) ptr + s->sh_offset;

	if (debug) {
		printf("e_type= %d\n", h->e_type);          	/* File type. */
		printf("e_machine= %d\n", h->e_machine);        /* Machine architecture. */
		printf("e_version= %d\n", h->e_version);        /* ELF format version. */
		printf("e_entry= %lu\n", h->e_entry);			/* Entry point. */
		printf("e_phoff= %lu\n", h->e_phoff);			/* Program header file offset. */
		printf("e_shoff= %lu\n", h->e_shoff);			/* Section header file offset. */
		printf("e_flags= %d\n", h->e_flags);            /* Architecture-specific flags. */
		printf("e_ehsize= %d\n", h->e_ehsize);          /* Size of ELF header in bytes. */
		printf("e_phentsize= %d\n", h->e_phentsize);    /* Size of program header entry. */
		printf("e_phnum= %d\n", h->e_phnum);            /* Number of program header entries. */
		printf("e_shentsize= %d\n", h->e_shentsize);    /* Size of section header entry. */
		printf("e_shnum= %d\n", h->e_shnum);            /* Number of section header entries. */
		printf("e_shstrndx= %d\n", h->e_shstrndx);      /* Section name strings section. */
	}

	for (i = 0; i < h->e_shnum; i += 1) {
		s = (Elf64_Shdr *) (ptr + h->e_shoff) + i;
		if (strcmp(n + s->sh_name, ".llvmbc")) {
			continue;
		}

		if (debug) {
			printf("%-3d %s\n", i, n + s->sh_name);
			printf("   sh_name = %u\n", s->sh_name);
			printf("   sh_type = %u\n", s->sh_type);
			printf("   sh_flags = %lu\n", s->sh_flags);
			printf("   sh_addr = %lu\n", s->sh_addr);
			printf("   sh_offset = %lu\n", s->sh_offset);
			printf("   sh_size = %lu\n", s->sh_size);
			printf("   sh_link = %u\n", s->sh_link);
			printf("   sh_info = %u\n", s->sh_info);
			printf("   sh_addralign = %lu\n", s->sh_addralign);
			printf("   sh_entsize = %lu\n", s->sh_entsize);
		}

		bc = ptr + s->sh_offset;
		sz = s->sh_size;

		while (sz > 0) {
			// skip 0 padded bytes

			while (sz > 0) {
				if (bc[0] != 0) {
					break;
				}
				sz -= 1;
				bc += 1;
			}

			// get module size, if any

			uint32_t n = dumpbits(bc, sz);
			if (n == 0) {
				break;
			}

			// dump module

			readmod(bc, n);
			
			// next module

			bc += n;
			sz -= n;
		}
	}
}